

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O3

char * apprun_argv_to_env(char **string_list)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = apprun_string_list_len(string_list);
  if (uVar1 == 0) {
    pcVar3 = (char *)calloc(1,1);
    return pcVar3;
  }
  uVar7 = (ulong)uVar1;
  uVar4 = 0;
  iVar6 = 0;
  do {
    sVar2 = strlen(string_list[uVar4]);
    iVar5 = iVar6 + (int)sVar2;
    iVar6 = iVar5 + 3;
    uVar4 = uVar4 + 1;
  } while (uVar7 != uVar4);
  uVar4 = 1;
  pcVar3 = (char *)calloc((ulong)(iVar5 + 4),1);
  if (uVar1 != 0) {
    do {
      sVar2 = strlen(pcVar3);
      (pcVar3 + sVar2)[0] = '\"';
      (pcVar3 + sVar2)[1] = '\0';
      strcat(pcVar3,string_list[uVar4 - 1]);
      sVar2 = strlen(pcVar3);
      (pcVar3 + sVar2)[0] = '\"';
      (pcVar3 + sVar2)[1] = '\0';
      if (uVar4 < uVar7) {
        sVar2 = strlen(pcVar3);
        (pcVar3 + sVar2)[0] = ' ';
        (pcVar3 + sVar2)[1] = '\0';
      }
      bVar8 = uVar4 != uVar7;
      uVar4 = uVar4 + 1;
    } while (bVar8);
  }
  return pcVar3;
}

Assistant:

char *apprun_argv_to_env(char *const *string_list) {
    unsigned string_list_len = apprun_string_list_len(string_list);
    unsigned str_size = 0;

    // space required by two quotation marks and one space
    const unsigned extra_chars_len = 3;

    for (int i = 0; i < string_list_len; i++)
        str_size += strlen(string_list[i]) + extra_chars_len;

    char *str = calloc(str_size + 1, sizeof(char));
    memset(str, 0, str_size + 1);

    for (int i = 0; i < string_list_len; i++) {
        strcat(str, "\"");
        strcat(str, string_list[i]);
        strcat(str, "\"");
        if (i + 1 < string_list_len)
            strcat(str, " ");
    }

    return str;
}